

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O1

int xmlGcMemGet(xmlFreeFunc *freeFunc,xmlMallocFunc *mallocFunc,xmlMallocFunc *mallocAtomicFunc,
               xmlReallocFunc *reallocFunc,xmlStrdupFunc *strdupFunc)

{
  if (freeFunc != (xmlFreeFunc *)0x0) {
    *freeFunc = xmlFree;
  }
  if (mallocFunc != (xmlMallocFunc *)0x0) {
    *mallocFunc = xmlMalloc;
  }
  if (mallocAtomicFunc != (xmlMallocFunc *)0x0) {
    *mallocAtomicFunc = xmlMallocAtomic;
  }
  if (reallocFunc != (xmlReallocFunc *)0x0) {
    *reallocFunc = xmlRealloc;
  }
  if (strdupFunc != (xmlStrdupFunc *)0x0) {
    *strdupFunc = xmlMemStrdup;
  }
  return 0;
}

Assistant:

int
xmlGcMemGet(xmlFreeFunc *freeFunc, xmlMallocFunc *mallocFunc,
            xmlMallocFunc *mallocAtomicFunc, xmlReallocFunc *reallocFunc,
	    xmlStrdupFunc *strdupFunc) {
    if (freeFunc != NULL) *freeFunc = xmlFree;
    if (mallocFunc != NULL) *mallocFunc = xmlMalloc;
    if (mallocAtomicFunc != NULL) *mallocAtomicFunc = xmlMallocAtomic;
    if (reallocFunc != NULL) *reallocFunc = xmlRealloc;
    if (strdupFunc != NULL) *strdupFunc = xmlMemStrdup;
    return(0);
}